

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O0

void __thiscall
CBlockPolicyEstimator::processBlock
          (CBlockPolicyEstimator *this,
          vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
          *txs_removed_for_block,uint nBlockHeight)

{
  long lVar1;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  bool bVar2;
  undefined1 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  uint in_EDX;
  ConstevalFormatString<7U> in_RSI;
  CBlockPolicyEstimator *in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000050;
  uint *in_stack_00000060;
  unsigned_long *in_stack_00000068;
  uint *in_stack_00000070;
  uint *in_stack_00000078;
  unsigned_long *in_stack_00000080;
  uint *in_stack_00000088;
  char **in_stack_00000090;
  RemovedMempoolTransactionInfo *tx;
  vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  uint countedTxs;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock2;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  char *in_stack_fffffffffffffeb0;
  CBlockPolicyEstimator *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  AnnotatedMixin<std::mutex> *in_stack_fffffffffffffee0;
  TxConfirmStats *in_stack_fffffffffffffee8;
  RemovedMempoolTransactionInfo *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff14;
  undefined1 in_stack_ffffffffffffff15;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  CBlockPolicyEstimator *pCVar9;
  char *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint uVar10;
  char *in_stack_ffffffffffffff78;
  int local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar9 = in_RDI;
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffee8,
             in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffec8 >> 0x18,0));
  uVar10 = (uint)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  if (in_RDI->nBestSeenHeight < in_EDX) {
    in_RDI->nBestSeenHeight = in_EDX;
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    TxConfirmStats::ClearCurrent(in_stack_fffffffffffffee8,uVar10);
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    TxConfirmStats::ClearCurrent(in_stack_fffffffffffffee8,uVar10);
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    TxConfirmStats::ClearCurrent(in_stack_fffffffffffffee8,uVar10);
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    TxConfirmStats::UpdateMovingAverages(in_stack_fffffffffffffee8);
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    TxConfirmStats::UpdateMovingAverages(in_stack_fffffffffffffee8);
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    TxConfirmStats::UpdateMovingAverages(in_stack_fffffffffffffee8);
    local_1c = 0;
    std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::
    begin((vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_> *)
          in_stack_fffffffffffffeb0);
    std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::end
              ((vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
                *)in_stack_fffffffffffffeb0);
    while (bVar2 = __gnu_cxx::
                   operator==<const_RemovedMempoolTransactionInfo_*,_std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>_>
                             ((__normal_iterator<const_RemovedMempoolTransactionInfo_*,_std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>_>
                               *)in_stack_fffffffffffffeb8,
                              (__normal_iterator<const_RemovedMempoolTransactionInfo_*,_std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>_>
                               *)in_stack_fffffffffffffeb0), ((bVar2 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_RemovedMempoolTransactionInfo_*,_std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>_>
      ::operator*((__normal_iterator<const_RemovedMempoolTransactionInfo_*,_std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>_>
                   *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      in_stack_ffffffffffffff17 =
           processBlockTx(in_RDI,CONCAT13(in_stack_ffffffffffffff17,
                                          CONCAT12(in_stack_ffffffffffffff16,
                                                   CONCAT11(in_stack_ffffffffffffff15,
                                                            in_stack_ffffffffffffff14))),
                          in_stack_ffffffffffffff08);
      if ((bool)in_stack_ffffffffffffff17) {
        local_1c = local_1c + 1;
      }
      __gnu_cxx::
      __normal_iterator<const_RemovedMempoolTransactionInfo_*,_std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>_>
      ::operator++((__normal_iterator<const_RemovedMempoolTransactionInfo_*,_std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>_>
                    *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    }
    if ((in_RDI->firstRecordedHeight == 0) && (local_1c != 0)) {
      in_RDI->firstRecordedHeight = in_RDI->nBestSeenHeight;
      in_stack_ffffffffffffff16 =
           ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),Trace);
      if ((bool)in_stack_ffffffffffffff16) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
        in_stack_fffffffffffffeb8 = (CBlockPolicyEstimator *)&in_RDI->firstRecordedHeight;
        in_stack_fffffffffffffeb0 = "Blockpolicy first recorded height %u\n";
        in_stack_fffffffffffffea8 = 1;
        logging_function._M_len._4_4_ = in_stack_ffffffffffffff74;
        logging_function._M_len._0_4_ = in_stack_ffffffffffffff70;
        logging_function._M_str = in_stack_ffffffffffffff78;
        source_file._M_str = in_stack_ffffffffffffff68;
        source_file._M_len = (size_t)pCVar9;
        LogPrintFormatInternal<unsigned_int>
                  (logging_function,source_file,(int)((ulong)in_RDI >> 0x20),
                   CONCAT17(in_stack_ffffffffffffff17,
                            CONCAT16(in_stack_ffffffffffffff16,
                                     CONCAT15(in_stack_ffffffffffffff15,
                                              CONCAT14(in_stack_ffffffffffffff14,
                                                       in_stack_ffffffffffffff10)))),
                   in_stack_00000050,(ConstevalFormatString<1U>)in_RSI.fmt,in_stack_00000060);
      }
    }
    uVar3 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),Trace)
    ;
    if ((bool)uVar3) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::
      size((vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_> *)
           CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      pcVar7 = (char *)std::
                       map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
                       ::size((map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
                               *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      uVar4 = MaxUsableEstimate(in_stack_fffffffffffffeb8);
      uVar10 = uVar4;
      uVar5 = HistoricalBlockSpan((CBlockPolicyEstimator *)in_stack_fffffffffffffeb0);
      uVar6 = BlockSpan((CBlockPolicyEstimator *)in_stack_fffffffffffffeb0);
      pcVar8 = "current";
      if (uVar6 < uVar5) {
        pcVar8 = "historical";
      }
      in_stack_fffffffffffffea8 = 1;
      logging_function_00._M_len._4_4_ = uVar10;
      logging_function_00._M_len._0_4_ = in_stack_ffffffffffffff70;
      logging_function_00._M_str = pcVar7;
      source_file_00._M_str = pcVar8;
      source_file_00._M_len = (size_t)pCVar9;
      LogPrintFormatInternal<unsigned_int,unsigned_long,unsigned_int,unsigned_int,unsigned_long,unsigned_int,char_const*>
                (logging_function_00,source_file_00,(int)((ulong)in_RDI >> 0x20),
                 CONCAT17(in_stack_ffffffffffffff17,
                          CONCAT16(in_stack_ffffffffffffff16,
                                   CONCAT15(uVar3,CONCAT14(in_stack_ffffffffffffff14,uVar4)))),
                 in_stack_00000050,in_RSI,in_stack_00000060,in_stack_00000068,in_stack_00000070,
                 in_stack_00000078,in_stack_00000080,in_stack_00000088,in_stack_00000090);
    }
    in_RDI->trackedTxs = 0;
    in_RDI->untrackedTxs = 0;
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CBlockPolicyEstimator::processBlock(const std::vector<RemovedMempoolTransactionInfo>& txs_removed_for_block,
                                         unsigned int nBlockHeight)
{
    LOCK(m_cs_fee_estimator);
    if (nBlockHeight <= nBestSeenHeight) {
        // Ignore side chains and re-orgs; assuming they are random
        // they don't affect the estimate.
        // And if an attacker can re-org the chain at will, then
        // you've got much bigger problems than "attacker can influence
        // transaction fees."
        return;
    }

    // Must update nBestSeenHeight in sync with ClearCurrent so that
    // calls to removeTx (via processBlockTx) correctly calculate age
    // of unconfirmed txs to remove from tracking.
    nBestSeenHeight = nBlockHeight;

    // Update unconfirmed circular buffer
    feeStats->ClearCurrent(nBlockHeight);
    shortStats->ClearCurrent(nBlockHeight);
    longStats->ClearCurrent(nBlockHeight);

    // Decay all exponential averages
    feeStats->UpdateMovingAverages();
    shortStats->UpdateMovingAverages();
    longStats->UpdateMovingAverages();

    unsigned int countedTxs = 0;
    // Update averages with data points from current block
    for (const auto& tx : txs_removed_for_block) {
        if (processBlockTx(nBlockHeight, tx))
            countedTxs++;
    }

    if (firstRecordedHeight == 0 && countedTxs > 0) {
        firstRecordedHeight = nBestSeenHeight;
        LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy first recorded height %u\n", firstRecordedHeight);
    }


    LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy estimates updated by %u of %u block txs, since last block %u of %u tracked, mempool map size %u, max target %u from %s\n",
             countedTxs, txs_removed_for_block.size(), trackedTxs, trackedTxs + untrackedTxs, mapMemPoolTxs.size(),
             MaxUsableEstimate(), HistoricalBlockSpan() > BlockSpan() ? "historical" : "current");

    trackedTxs = 0;
    untrackedTxs = 0;
}